

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O1

void __thiscall board::Board::print(Board *this)

{
  undefined8 in_RAX;
  ostream *poVar1;
  int *piVar2;
  int file;
  long lVar3;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  undefined8 uStack_38;
  
  pcVar4 = "     black";
  if (this->side == 0) {
    pcVar4 = "     white";
  }
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  piVar2 = this->board + 0x5b;
  lVar5 = 7;
  do {
    lVar3 = 0;
    do {
      uStack_38 = CONCAT17(PIECE_CHARS[piVar2[lVar3]],(undefined7)uStack_38);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    piVar2 = piVar2 + -10;
    bVar6 = lVar5 != 0;
    lVar5 = lVar5 + -1;
  } while (bVar6);
  return;
}

Assistant:

void board::Board::print() const
{
    int square;
    int piece;
    if (side == WHITE) {
        std::cout << "     white" << std::endl;
    }
    else {
        std::cout << "     black" << std::endl;
    }
    for (int rank = RANK_8; rank >= RANK_1; rank--) {
        for (int file = FILE_A; file <= FILE_H; file++) {
            square = FR2SQ(file, rank);
            piece = board[square];
            std::cout << PIECE_CHARS[piece] << " ";
        }
        std::cout << std::endl;
    }
}